

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteSFixed64
               (int field_number,int64 value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  if (uVar5 < 0x80) {
    *pbVar2 = (byte)uVar5 | 1;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar5 | 0x81;
    if (uVar5 < 0x4000) {
      pbVar2[1] = (byte)(uVar5 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
      *pbVar3 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  *(int64 *)pbVar2 = value;
  output->cur_ = pbVar2 + 8;
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64(int field_number, int64 value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteSFixed64NoTag(value, output);
}